

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

scalar __thiscall absl::make_unique<S2ClosestCellQuery,S2CellIndex*>(absl *this,S2CellIndex **args)

{
  S2CellIndex *index;
  S2ClosestCellQuery *this_00;
  Options local_38;
  S2CellIndex **local_18;
  S2CellIndex **args_local;
  
  local_18 = args;
  args_local = (S2CellIndex **)this;
  this_00 = (S2ClosestCellQuery *)operator_new(0x270);
  index = *local_18;
  local_38.super_Options.region_ = (S2Region *)0x0;
  local_38.super_Options.max_results_ = 0;
  local_38.super_Options.use_brute_force_ = false;
  local_38.super_Options._29_3_ = 0;
  local_38.super_Options.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)0.0;
  local_38.super_Options.max_error_.length2_ = 0.0;
  S2ClosestCellQuery::Options::Options(&local_38);
  S2ClosestCellQuery::S2ClosestCellQuery(this_00,index,&local_38);
  std::unique_ptr<S2ClosestCellQuery,std::default_delete<S2ClosestCellQuery>>::
  unique_ptr<std::default_delete<S2ClosestCellQuery>,void>
            ((unique_ptr<S2ClosestCellQuery,std::default_delete<S2ClosestCellQuery>> *)this,this_00)
  ;
  return (__uniq_ptr_data<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>,_true,_true>)
         (__uniq_ptr_data<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>,_true,_true>)
         this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}